

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmdump.cpp
# Opt level: O1

void mmdump(int f,uint64_t offset,uint64_t length,uint64_t step,uint64_t width,int access,
           int mmapmode)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint8_t *src;
  long lVar3;
  undefined4 in_register_0000008c;
  uint8_t *puVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  mappedmem m;
  allocator_type local_c0 [24];
  uint64_t local_a8;
  long local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  undefined8 local_80;
  ulong local_78;
  uint64_t local_70;
  uint8_t *local_68;
  uint8_t *local_60;
  long local_58;
  mappedmem local_50;
  
  local_80 = CONCAT44(in_register_0000008c,access);
  local_a8 = offset;
  local_70 = step;
  mappedmem::mappedmem(&local_50,f,offset,length + offset,mmapmode);
  local_68 = (uint8_t *)width;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_98,width,local_c0);
  src = local_50.pmem + local_50.dataofs;
  puVar2 = src + length;
  if (src < puVar2) {
    local_a0 = (long)(int)local_80;
    lVar3 = -(long)(local_50.pmem + local_50.dataofs);
    local_78 = (ulong)((int)local_80 - 1);
    do {
      puVar1 = local_68;
      puVar2 = puVar2 + lVar3;
      puVar4 = local_68;
      if (puVar2 < local_68) {
        puVar4 = puVar2;
      }
      local_60 = src;
      local_58 = lVar3;
      copydata(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,src,(int)puVar4,(int)local_80);
      if (puVar2 < puVar1) {
        memset(puVar4 + (long)local_98.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,0,(long)puVar1 - (long)puVar4
              );
      }
      if ((uint)local_78 < 8) {
        (*(code *)(&DAT_0010b024 + *(int *)(&DAT_0010b024 + local_78 * 4)))();
        return;
      }
      local_a8 = local_a8 + local_70;
      src = local_60 + local_70;
      puVar2 = local_50.pmem + length + local_50.dataofs;
      lVar3 = local_58 - local_70;
    } while (src < puVar2);
  }
  if (local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  mappedmem::~mappedmem(&local_50);
  return;
}

Assistant:

void mmdump(int f, uint64_t offset, uint64_t length, uint64_t step, uint64_t width, int access, int mmapmode)
{
    mappedmem m(f, offset, offset+length, mmapmode);

    std::vector<uint8_t> data(width);
    for (uint8_t *p= m.data() ; p<m.data()+length ; p+=step)
    {
        uint64_t want= std::min((uint64_t)(m.data()+length-p), width);
        copydata(&data[0], p, want, access);
        if (want<width)
            std::fill(&data[want], &data[width], 0);
        switch(access)
        {
        case 1: print("%08llx: %b", offset, std::vector<uint8_t>(&data[0], &data[0]+width/access));
        case 2: print("%08llx: %b", offset, std::vector<uint16_t>(&data[0], &data[0]+width/access));
        case 4: print("%08llx: %b", offset, std::vector<uint32_t>(&data[0], &data[0]+width/access));
        case 8: print("%08llx: %b", offset, std::vector<uint64_t>(&data[0], &data[0]+width/access));
        }

        offset += step;
    }
}